

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void show_usage(string *name)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"DGRMiner, version 3.0.0");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Author: Karel Vaculik (vaculik.dev@gmail.com)");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1," <option(s)>");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-h, --help\t\tShows this help message");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-v, --verbose\t\tVerbose output");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-i INPUTFILE\t\tSpecifies the input file");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-o OUTPUTFILE\t\tSpecifies the common prefix for output files")
  ;
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "\t-s K\t\t\tSpecifies the minimum support; decimal value from [0.0, 1.0] if old support measure is used"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "\t-c M\t\t\tSpecifies the minimum confidence; decimal value from [0.0, 1.0]; if not specified, the confidence is not computed"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-w N\t\t\tSpecifies the size of window; 10 by default");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-t {bin_nodes,bin_all}\tSpecifies the type of time abstraction"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "\t-a A\t\t\tSwitches to anomaly detection; Only anomalies with outlierness >= A will be outputted; A is a decimal value from [0.0, 1.0]"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"\t-m new measures Use new support and dynamic measures.");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "\t-e heuristics \tUse heuristic version of the algorithm for computing MIS size."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void show_usage(std::string name)
{
	std::cerr << "DGRMiner, version 3.0.0"
			  << std::endl
			  << "Author: Karel Vaculik (vaculik.dev@gmail.com)"
			  << std::endl
			  << std::endl
			  << "Usage: " << name << " <option(s)>"
			  << std::endl
			  << std::endl
			  << "\t-h, --help\t\tShows this help message"
			  << std::endl
			  << "\t-v, --verbose\t\tVerbose output"
			  << std::endl
			  << "\t-i INPUTFILE\t\tSpecifies the input file"
			  << std::endl
			  << "\t-o OUTPUTFILE\t\tSpecifies the common prefix for output files"
			  << std::endl
			  << "\t-s K\t\t\tSpecifies the minimum support; decimal value from [0.0, 1.0] if old support measure is used"
			  << std::endl
			  << "\t-c M\t\t\tSpecifies the minimum confidence; decimal value from [0.0, 1.0]; if not specified, the confidence is not computed"
			  << std::endl
			  << "\t-w N\t\t\tSpecifies the size of window; 10 by default"
			  << std::endl
			  << "\t-t {bin_nodes,bin_all}\tSpecifies the type of time abstraction"
			  << std::endl
			  << "\t-a A\t\t\tSwitches to anomaly detection; Only anomalies with outlierness >= A will be outputted; A is a decimal value from [0.0, 1.0]"
			  << std::endl
			  << "\t-m new measures Use new support and dynamic measures."
			  << std::endl
			  << "\t-e heuristics \tUse heuristic version of the algorithm for computing MIS size."
			  << std::endl;
}